

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::AddLineInfos(SQFuncState *this,SQInteger line,bool lineop,bool force)

{
  SQInteger SVar1;
  undefined1 local_30 [8];
  SQLineInfo li;
  bool force_local;
  bool lineop_local;
  SQInteger line_local;
  SQFuncState *this_local;
  
  if ((this->_lastline != line) || (force)) {
    local_30 = (undefined1  [8])line;
    li._op._6_1_ = force;
    li._op._7_1_ = lineop;
    SVar1 = GetCurrentPos(this);
    li._line = SVar1 + 1;
    if ((li._op._7_1_ & 1) != 0) {
      AddInstruction(this,_OP_LINE,0,line,0,0);
    }
    if (this->_lastline != line) {
      sqvector<SQLineInfo>::push_back(&this->_lineinfos,(SQLineInfo *)local_30);
    }
    this->_lastline = line;
  }
  return;
}

Assistant:

void SQFuncState::AddLineInfos(SQInteger line,bool lineop,bool force)
{
    if(_lastline!=line || force){
        SQLineInfo li;
        li._line=line;li._op=(GetCurrentPos()+1);
        if(lineop)AddInstruction(_OP_LINE,0,line);
        if(_lastline!=line) {
            _lineinfos.push_back(li);
        }
        _lastline=line;
    }
}